

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

string * __thiscall
kws::Parser::RemoveComments_abi_cxx11_(string *__return_storage_ptr__,Parser *this,char *buffer)

{
  value_type *__x;
  pointer ppVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  string *this_00;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  vector<char,_std::allocator<char>_> outBuffer;
  string tempbuf;
  allocator local_99;
  ulong local_98;
  char *local_90;
  _Vector_base<char,_std::allocator<char>_> local_88;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *local_70;
  value_type local_68 [2];
  Parser *local_48;
  string *local_40;
  ulong local_38;
  
  local_90 = buffer;
  if (buffer == (char *)0x0) {
    ppVar1 = (this->m_CommentPositions).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_CommentPositions).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
      (this->m_CommentPositions).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
    }
    pcVar9 = (this->m_Buffer)._M_dataplus._M_p;
    local_88._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar7 = (this->m_Buffer)._M_string_length;
  }
  else {
    local_88._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)local_68,buffer,&local_99);
    uVar7 = local_68[0].second;
    std::__cxx11::string::~string((string *)local_68);
    pcVar9 = buffer;
  }
  local_40 = __return_storage_ptr__;
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)&local_88,uVar7 + 1);
  local_38 = uVar7 - 1;
  local_70 = &this->m_CommentPositions;
  local_98 = 0;
  bVar3 = false;
  bVar4 = false;
  bVar2 = 0;
  uVar8 = 0;
  local_48 = this;
  do {
    if (uVar7 == uVar8) {
      local_68[0].first = local_68[0].first & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                ((vector<char,_std::allocator<char>_> *)&local_88,(char *)local_68);
      this_00 = local_40;
      if (local_90 == (char *)0x0) {
        std::__cxx11::string::assign((char *)&local_48->m_BufferNoComment);
        std::__cxx11::string::string((string *)this_00,"",(allocator *)local_68);
      }
      else {
        std::__cxx11::string::string
                  ((string *)local_40,local_88._M_impl.super__Vector_impl_data._M_start,
                   (allocator *)local_68);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_88);
      return this_00;
    }
    __x = pcVar9 + uVar8;
    cVar6 = *__x;
    if ((cVar6 == '\"') && ((uVar8 == 0 || (pcVar9[uVar8 - 1] != '\\')))) {
      bVar5 = !bVar3;
      bVar3 = true;
      if (bVar5) goto LAB_0011e1a7;
LAB_0011e0e6:
      if (bVar4) {
        if (!(bool)(~bVar2 & 1) && cVar6 == '\n') {
          local_68[0].first = local_98;
          local_68[0].second = uVar8;
          if (local_90 == (char *)0x0) {
            std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::push_back(local_70,local_68);
          }
          cVar6 = *__x;
          bVar4 = false;
          bVar2 = 0;
        }
        bVar3 = false;
        if ((uVar8 != 0xffffffffffffffff) && (cVar6 == '/')) {
          if (pcVar9[uVar8 - 1] == '*') {
            local_68[0].second = uVar8 + 1;
            local_68[0].first = local_98;
            if (local_90 == (char *)0x0) {
              std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::push_back(local_70,local_68);
            }
            bVar4 = false;
            bVar3 = false;
            goto LAB_0011e1ba;
          }
LAB_0011e1a4:
          bVar3 = false;
        }
        goto LAB_0011e1a7;
      }
      bVar3 = false;
      if ((local_38 <= uVar8) || (cVar6 != '/')) goto LAB_0011e1a7;
      if (pcVar9[uVar8 + 1] == '/') {
        bVar2 = 1;
      }
      else if (pcVar9[uVar8 + 1] != '*') goto LAB_0011e1a4;
      bVar3 = false;
      bVar4 = true;
      local_98 = uVar8;
    }
    else {
      bVar5 = !bVar3;
      bVar3 = true;
      if (bVar5) goto LAB_0011e0e6;
LAB_0011e1a7:
      if (!bVar4) {
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)&local_88,__x);
      }
    }
LAB_0011e1ba:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

std::string Parser::RemoveComments(const char* buffer)
{
  if(!buffer)
    {
    m_CommentPositions.clear();
    }
  size_t cc;
  const char* inch;
  if(buffer)
    {
    inch = buffer;
    }
  else
    {
    inch = m_Buffer.c_str();
    }

  std::vector<char> outBuffer;
  size_t inStrSize = m_Buffer.size();
  if(buffer)
    {
    std::string tempbuf = buffer;
    inStrSize = tempbuf.size();
    }
  // Reserve enough space for all files. The size will be at least the size of
  // the file.
  outBuffer.reserve(inStrSize+1);

  bool inString  = false;
  bool inComment = false;
  bool copyChar;
  bool cppComment = false;

  size_t beginOfComment = 0;
  size_t endOfComment = 0;

  for ( cc = 0; cc < inStrSize; ++ cc )
    {
    copyChar = true;

    // it is important to know if we are in a string---if we are then
    // we don't care about comment-ish symbols
    //
    // we are starting or ending a string if we find a " without a
    // preceeding '\'
    bool isStringBarrier = (*inch == '"') && (cc == 0 || *(inch-1) != '\\');
    inString = isStringBarrier ? !inString : inString;

    if (!inString)
      {
      if ( !inComment )
        {
        if ( *inch == '/' )
          {
          if ( cc < inStrSize-1 )
            {
            if ( *(inch+1) == '*' )
              {
              inComment = true;
              beginOfComment = cc;
              }
            else if ( *(inch+1) == '/' )
              {
              inComment = true;
              beginOfComment = cc;
              cppComment = true;
              }
            }
          }
        }
      else
        {
        if ( cppComment && *inch == '\n' )
          {
          endOfComment = cc;
          inComment = false;
          copyChar = true;
          cppComment = false;
          PairType pair(beginOfComment, endOfComment);
          if(!buffer)
            {
            m_CommentPositions.push_back(pair);
            }
          }
        if ( *inch == '/' )
          {
          if ( cc != std::string::npos && *(inch-1) == '*' )
            {
            endOfComment = cc+1;
            inComment = false;
            copyChar = false;
            PairType pair(beginOfComment, endOfComment);
            if(!buffer)
              {
              m_CommentPositions.push_back(pair);
              }
            }
          }
        }
      }
    if ( inComment )
      {
      copyChar = false;
      }
    if ( copyChar )
      {
      outBuffer.push_back(*inch);
      }
    inch++;
    }
  outBuffer.push_back(0);
  if(buffer)
    {
    return &*outBuffer.begin();
    }
  else
    {
    m_BufferNoComment = &*outBuffer.begin();
    }

  return "";
}